

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

Am_Object * __thiscall
Am_Object::Set(Am_Object *this,Am_Slot_Key key,Am_Constraint *constraint,Am_Slot_Flags set_flags)

{
  ostream *poVar1;
  
  if (this->data != (Am_Object_Data *)0x0) {
    Am_Object_Data::set_slot(this->data,key,constraint,set_flags | 8);
    return this;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
  poVar1 = std::operator<<(poVar1,"** Set called on a (0L) object.");
  ::operator<<(poVar1,this);
  std::endl<char,std::char_traits<char>>(poVar1);
  Am_Error();
}

Assistant:

Am_Object &
Am_Object::Set(Am_Slot_Key key, Am_Constraint *constraint,
               Am_Slot_Flags set_flags)
{
  if (!data)
    Am_ERROR("** Set called on a (0L) object." << *this);
  data->set_slot(key, constraint, set_flags | Am_OK_IF_THERE);
  return *this;
}